

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::count::~count(count *this)

{
  ostream *poVar1;
  allocator<char> local_51;
  text local_50;
  text local_30;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->n);
  poVar1 = std::operator<<(poVar1," selected ");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test",&local_51);
  pluralise(&local_30,&local_50,this->n);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

~count()
    {
        os << n << " selected " << pluralise("test", n) << "\n";
    }